

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createAnonymousPrimitiveValueType
          (sysbvm_context_t *context,sysbvm_tuple_t supertype,sysbvm_tuple_t metaclass)

{
  size_t slotCount;
  sysbvm_object_tuple_t *psVar1;
  
  slotCount = sysbvm_type_getTotalSlotCount(metaclass);
  if (slotCount < 0x1d) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/type.c:139: assertion failure: typeSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_primitiveValueType_t)"
              );
  }
  psVar1 = sysbvm_context_allocatePointerTuple(context,metaclass,slotCount);
  psVar1[2].header.field_0.typePointer = supertype;
  psVar1[3].field_1.pointers[0] = 0xb;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  psVar1[4].field_1.pointers[0] = 0x96b;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousPrimitiveValueType(sysbvm_context_t *context, sysbvm_tuple_t supertype, sysbvm_tuple_t metaclass)
{
    size_t typeSlotCount = sysbvm_type_getTotalSlotCount(metaclass);
    SYSBVM_ASSERT(typeSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_primitiveValueType_t));

    sysbvm_primitiveValueType_t* result = (sysbvm_primitiveValueType_t*)sysbvm_context_allocatePointerTuple(context, metaclass, typeSlotCount);
    result->super.super.supertype = supertype;
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_DEFAULT_FLAGS);
    return (sysbvm_tuple_t)result;
}